

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_artifact_act(parser *p)

{
  void *pvVar1;
  char *act_name;
  object_kind *poVar2;
  activation *paVar3;
  char *name;
  object_kind *k;
  artifact *a;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  act_name = parser_getstr(p,"name");
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    poVar2 = lookup_kind(*(wchar_t *)((long)pvVar1 + 0x20),*(wchar_t *)((long)pvVar1 + 0x24));
    if ((*(int *)((long)pvVar1 + 0x20) == 0x13) && ((uint)z_info->ordinary_kind_max <= poVar2->kidx)
       ) {
      paVar3 = findact(act_name);
      poVar2->activation = paVar3;
    }
    else {
      paVar3 = findact(act_name);
      *(activation **)((long)pvVar1 + 0x120) = paVar3;
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_artifact_act(struct parser *p) {
	struct artifact *a = parser_priv(p);
	struct object_kind *k;
	const char *name = parser_getstr(p, "name");

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* Special light activations are a property of the base object */
	k = lookup_kind(a->tval, a->sval);
	if ((a->tval == TV_LIGHT) && (k->kidx >= z_info->ordinary_kind_max)) {
		k->activation = findact(name);
	} else {
		a->activation = findact(name);
	}
	return PARSE_ERROR_NONE;
}